

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void write_section(char *section_name)

{
  FILE *__stream;
  int iVar1;
  char ***pppcVar2;
  char **ppcVar3;
  
  pppcVar2 = &section_list[0].ptr;
  while( true ) {
    if (((section *)(pppcVar2 + -1))->name == (char *)0x0) {
      fprintf(_stderr,"Cannot find section \'%s\' in your skeleton file\n",section_name);
      exit(1);
    }
    iVar1 = strcmp(((section *)(pppcVar2 + -1))->name,section_name);
    __stream = code_file;
    if (iVar1 == 0) break;
    pppcVar2 = pppcVar2 + 2;
  }
  for (ppcVar3 = *pppcVar2 + (lflag != '\0'); *ppcVar3 != (char *)0x0; ppcVar3 = ppcVar3 + 1) {
    outline = outline + 1;
    fprintf((FILE *)__stream,"%s\n");
  }
  return;
}

Assistant:

void write_section(char *section_name)
{
    char **section;
    FILE *fp;
    int i;
    struct section *sl;

    for(sl=&section_list[0]; sl->name; sl++) {
      if(strcmp(sl->name,section_name)==0) {
	break;
      }
    }
    if(sl->name==0) {
      fprintf(stderr, "Cannot find section '%s' in your skeleton file\n", section_name);
      exit(1);
    }

    section =  sl->ptr;
    fp = code_file;
    for (i = lflag ? 1 : 0; section[i]; ++i)
    {
	++outline;
	fprintf(fp, "%s\n", section[i]);
    }
}